

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::Picker::scrollTo(Picker *this,int index)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  PickerPrivate *pPVar3;
  QPersistentModelIndex top;
  QModelIndex mi;
  QModelIndex local_60;
  QModelIndex local_48;
  
  pPVar3 = (this->d).d;
  pQVar1 = pPVar3->model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&pPVar3->root);
  iVar2 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_48);
  pPVar3 = (this->d).d;
  if (pPVar3->itemsCount < iVar2) {
    pQVar1 = pPVar3->model;
    iVar2 = pPVar3->modelColumn;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&pPVar3->root);
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_48,pQVar1,index,iVar2,&local_60);
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_60,&local_48);
    pPVar3 = (this->d).d;
    if (1 < pPVar3->itemsCount) {
      iVar2 = 0;
      do {
        PickerPrivate::makePrevIndex(pPVar3,(QPersistentModelIndex *)&local_60);
        iVar2 = iVar2 + 1;
        pPVar3 = (this->d).d;
      } while (iVar2 < pPVar3->itemsCount / 2);
    }
    QPersistentModelIndex::operator=(&pPVar3->topItemIndex,(QPersistentModelIndex *)&local_60);
    ((this->d).d)->drawItemOffset = 0;
    QWidget::update();
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_60);
  }
  return;
}

Assistant:

void
Picker::scrollTo( int index )
{
	if( count() > d->itemsCount )
	{
		QModelIndex mi = d->model->index( index, d->modelColumn, d->root );
		QPersistentModelIndex top = mi;

		for( int i = 0; i < d->itemsCount / 2; ++i )
			d->makePrevIndex( top );

		d->topItemIndex = top;
		d->drawItemOffset = 0;

		update();
	}
}